

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O2

void __thiscall
QHttp2ProtocolHandler::initReplyFromPushPromise
          (QHttp2ProtocolHandler *this,HttpMessagePair *message,QUrl *cacheKey)

{
  State SVar1;
  ulong uVar2;
  QHttp2Stream *stream;
  QLoggingCategory *pQVar3;
  QDebug *this_00;
  QByteArray *_t1;
  qsizetype i;
  ulong i_00;
  long in_FS_OFFSET;
  vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> local_70;
  QByteDataBuffer local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  stream = QHttp2Connection::promisedStream(*(QHttp2Connection **)(this + 0x38),cacheKey);
  QHttpNetworkReply::setHttp2WasUsed((QHttpNetworkReply *)message->second,true);
  pQVar3 = QtPrivateLogging::QT_HTTP2();
  if (((pQVar3->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_58.bufferCompleteSize = (qint64)pQVar3->name;
    local_58.buffers.d.d._0_4_ = 2;
    local_58.buffers.d.d._4_4_ = 0;
    local_58.buffers.d.ptr._0_4_ = 0;
    local_58.buffers.d.ptr._4_4_ = 0;
    local_58.buffers.d.size._0_4_ = 0;
    local_58.buffers.d.size._4_4_ = 0;
    QMessageLogger::debug();
    this_00 = QDebug::operator<<((QDebug *)&local_70,"found cached/promised response on stream");
    QDebug::operator<<(this_00,stream->m_streamID);
    QDebug::~QDebug((QDebug *)&local_70);
  }
  SVar1 = stream->m_state;
  connectStream(this,message,stream);
  local_58.firstPos = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  local_58.buffers.d.size._0_4_ = 0xaaaaaaaa;
  local_58.buffers.d.size._4_4_ = 0xaaaaaaaa;
  local_58.bufferCompleteSize = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  local_58.buffers.d.d._0_4_ = 0xaaaaaaaa;
  local_58.buffers.d.d._4_4_ = 0xaaaaaaaa;
  local_58.buffers.d.ptr._0_4_ = 0xaaaaaaaa;
  local_58.buffers.d.ptr._4_4_ = 0xaaaaaaaa;
  QHttp2Stream::takeDownloadBuffer(&local_58,(QHttp2Stream *)stream);
  std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::vector
            (&local_70,&stream->m_headers);
  if (local_70.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_70.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    QHttp2Stream::headersReceived
              ((QHttp2Stream *)stream,&local_70,
               (undefined1 *)local_58.bufferCompleteSize == (undefined1 *)0x0 && SVar1 == Closed);
  }
  std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::~vector(&local_70);
  if ((undefined1 *)local_58.bufferCompleteSize != (undefined1 *)0x0) {
    for (i_00 = 0;
        uVar2 = CONCAT44(local_58.buffers.d.size._4_4_,(undefined4)local_58.buffers.d.size),
        i_00 < uVar2; i_00 = i_00 + 1) {
      _t1 = QByteDataBuffer::operator[](&local_58,i_00);
      QHttp2Stream::dataReceived((QHttp2Stream *)stream,_t1,i_00 == uVar2 - 1 && SVar1 == Closed);
    }
  }
  QArrayDataPointer<QByteArray>::~QArrayDataPointer((QArrayDataPointer<QByteArray> *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2ProtocolHandler::initReplyFromPushPromise(const HttpMessagePair &message,
                                                     const QUrl &cacheKey)
{
    QHttp2Stream *promise = h2Connection->promisedStream(cacheKey);
    Q_ASSERT(promise);
    Q_ASSERT(message.second);
    message.second->setHttp2WasUsed(true);

    qCDebug(QT_HTTP2) << "found cached/promised response on stream" << promise->streamID();

    const bool replyFinished = promise->state() == QHttp2Stream::State::Closed;

    connectStream(message, promise);

    // Now that we have connect()ed, re-emit signals so that the reply
    // can be processed as usual:

    QByteDataBuffer downloadBuffer = promise->takeDownloadBuffer();
    if (const auto &headers = promise->receivedHeaders(); !headers.empty())
        emit promise->headersReceived(headers, replyFinished && downloadBuffer.isEmpty());

    if (!downloadBuffer.isEmpty()) {
        for (qsizetype i = 0; i < downloadBuffer.bufferCount(); ++i) {
            const bool streamEnded = replyFinished && i == downloadBuffer.bufferCount() - 1;
            emit promise->dataReceived(downloadBuffer[i], streamEnded);
        }
    }
}